

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O3

TypeInfo * readTypeInfo(TypeInfo *__return_storage_ptr__,XMLElement *element)

{
  XMLNode *pXVar1;
  size_type __len1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  size_t __len2;
  undefined4 extraout_var_00;
  string result;
  allocator<char> local_e2;
  allocator<char> local_e1;
  string local_e0;
  undefined1 *local_c0;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  string local_98;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  char *local_50;
  string local_48;
  
  (__return_storage_ptr__->prefix)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->prefix).field_2;
  (__return_storage_ptr__->prefix)._M_string_length = 0;
  (__return_storage_ptr__->prefix).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->type)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->type).field_2
  ;
  (__return_storage_ptr__->type)._M_string_length = 0;
  (__return_storage_ptr__->type).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->postfix)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->postfix).field_2;
  (__return_storage_ptr__->postfix)._M_string_length = 0;
  (__return_storage_ptr__->postfix).field_2._M_local_buf[0] = '\0';
  pXVar1 = (element->super_XMLNode)._prev;
  if (pXVar1 != (XMLNode *)0x0) {
    iVar2 = (*pXVar1->_vptr_XMLNode[7])(pXVar1);
    if (CONCAT44(extraout_var,iVar2) != 0) {
      pcVar3 = tinyxml2::XMLNode::Value(pXVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar3,&local_e2);
      trim(&local_48,&local_98);
      readTypeInfo();
    }
  }
  pcVar3 = tinyxml2::XMLElement::GetText(element);
  __len1 = (__return_storage_ptr__->type)._M_string_length;
  __len2 = strlen(pcVar3);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&__return_storage_ptr__->type,0,__len1,pcVar3,__len2);
  pXVar1 = (element->super_XMLNode)._next;
  if (pXVar1 != (XMLNode *)0x0) {
    iVar2 = (*pXVar1->_vptr_XMLNode[7])(pXVar1);
    if (CONCAT44(extraout_var_00,iVar2) != 0) {
      pcVar3 = tinyxml2::XMLNode::Value(pXVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar3,&local_e1);
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,local_b8,local_b0 + (long)local_b8);
      local_50 = local_e0._M_dataplus._M_p + local_e0._M_string_length;
      local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_e0._M_dataplus._M_p;
      std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<trimEnd(std::__cxx11::string_const&)::_lambda(char)_1_>>
                (&local_c0);
      local_e0._M_string_length = (long)local_c0 - (long)local_e0._M_dataplus._M_p;
      *local_c0 = 0;
      trimStars(&local_78,&local_e0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&__return_storage_ptr__->postfix,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline TypeInfo readTypeInfo( tinyxml2::XMLElement const * element )
{
  TypeInfo                  typeInfo;
  tinyxml2::XMLNode const * previousSibling = element->PreviousSibling();
  if ( previousSibling && previousSibling->ToText() )
  {
    typeInfo.prefix = trim( previousSibling->Value() );
  }
  typeInfo.type                         = element->GetText();
  tinyxml2::XMLNode const * nextSibling = element->NextSibling();
  if ( nextSibling && nextSibling->ToText() )
  {
    typeInfo.postfix = trimStars( trimEnd( nextSibling->Value() ) );
  }
  return typeInfo;
}